

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_string.hpp
# Opt level: O2

type_conflict2
jsoncons::detail::
encode_base64_generic<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::__cxx11::wstring>
          (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           first,__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 last,char *alphabet,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *result)

{
  char cVar1;
  type_conflict2 tVar2;
  ulong uVar3;
  long lVar4;
  wchar_t wVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lStack_60;
  uchar uStack_50;
  uchar a3 [3];
  uchar a4 [4];
  
  cVar1 = alphabet[0x40];
  lVar4 = 0;
  tVar2 = 0;
  lStack_60 = 1;
  while( true ) {
    lVar7 = lStack_60;
    wVar5 = (wchar_t)result;
    if (first._M_current + lVar7 + -1 == last._M_current) break;
    a3[lVar7 + -1] = first._M_current[lVar7 + -1];
    lStack_60 = lVar7 + 1;
    if ((int)(lVar7 + 1) == 4) {
      first._M_current = first._M_current + lVar7;
      for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
        std::__cxx11::wstring::push_back(wVar5);
      }
      tVar2 = tVar2 + 4;
      lVar4 = lVar4 + -4;
      lStack_60 = 1;
    }
  }
  if ((int)lVar7 != 1) {
    uVar6 = lVar7 - 1;
    for (uVar3 = uVar6; lVar8 = lVar7, (int)uVar3 < 3; uVar3 = uVar3 + 1) {
      a3[uVar3] = '\0';
    }
    while (lVar8 != 0) {
      std::__cxx11::wstring::push_back(wVar5);
      lVar8 = lVar8 + -1;
    }
    tVar2 = lVar7 - lVar4;
    if (cVar1 != '\0') {
      for (; (uint)uVar6 < 3; uVar6 = (ulong)((uint)uVar6 + 1)) {
        std::__cxx11::wstring::push_back(wVar5);
        tVar2 = tVar2 + 1;
      }
    }
  }
  return tVar2;
}

Assistant:

typename std::enable_if<std::is_same<typename std::iterator_traits<InputIt>::value_type,uint8_t>::value,size_t>::type
    encode_base64_generic(InputIt first, InputIt last, const char alphabet[65], Container& result)
    {
        std::size_t count = 0;
        unsigned char a3[3];
        unsigned char a4[4];
        unsigned char fill = alphabet[64];
        int i = 0;
        int j = 0;

        while (first != last)
        {
            a3[i++] = *first++;
            if (i == 3)
            {
                a4[0] = (a3[0] & 0xfc) >> 2;
                a4[1] = ((a3[0] & 0x03) << 4) + ((a3[1] & 0xf0) >> 4);
                a4[2] = ((a3[1] & 0x0f) << 2) + ((a3[2] & 0xc0) >> 6);
                a4[3] = a3[2] & 0x3f;

                for (i = 0; i < 4; i++) 
                {
                    result.push_back(alphabet[a4[i]]);
                    ++count;
                }
                i = 0;
            }
        }

        if (i > 0)
        {
            for (j = i; j < 3; ++j) 
            {
                a3[j] = 0;
            }

            a4[0] = (a3[0] & 0xfc) >> 2;
            a4[1] = ((a3[0] & 0x03) << 4) + ((a3[1] & 0xf0) >> 4);
            a4[2] = ((a3[1] & 0x0f) << 2) + ((a3[2] & 0xc0) >> 6);

            for (j = 0; j < i + 1; ++j) 
            {
                result.push_back(alphabet[a4[j]]);
                ++count;
            }

            if (fill != 0)
            {
                while (i++ < 3) 
                {
                    result.push_back(fill);
                    ++count;
                }
            }
        }

        return count;
    }